

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O0

void __thiscall PayToAnchor::PayToAnchor(PayToAnchor *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int line;
  char *file;
  allocator_type *in_stack_ffffffffffffff80;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  undefined1 *puVar1;
  char local_49 [31];
  undefined1 local_2a;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = 0x4e;
  local_9 = 0x73;
  puVar1 = &local_a;
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff48);
  __l._M_len = (size_type)puVar1;
  __l._M_array = in_stack_ffffffffffffff90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff88,__l,in_stack_ffffffffffffff80);
  WitnessUnknown::WitnessUnknown
            ((WitnessUnknown *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff54,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff48);
  local_c = 0x4e;
  local_b = 0x73;
  __a = (allocator_type *)0x2;
  file = local_49;
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff48);
  __l_00._M_len = (size_type)puVar1;
  __l_00._M_array = in_stack_ffffffffffffff90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff88,__l_00,__a);
  local_2a = CScript::IsPayToAnchor
                       (in_stack_ffffffffffffff5c,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  line = CONCAT13(local_2a,(int3)in_stack_ffffffffffffff5c);
  inline_assertion_check<false,bool>
            (in_RDI,file,line,(char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (char *)in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(line,in_stack_ffffffffffffff58));
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PayToAnchor() : WitnessUnknown(1, {0x4e, 0x73}) {
        Assume(CScript::IsPayToAnchor(1, {0x4e, 0x73}));
    }